

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetwork * addSoftmaxLayer(Model *m,char *name,char *input,char *output)

{
  int iVar1;
  Rep *pRVar2;
  ulong uVar3;
  NeuralNetwork *pNVar4;
  NeuralNetworkLayer *pNVar5;
  SoftmaxLayerParams *pSVar6;
  undefined8 *puVar7;
  Arena *pAVar8;
  
  if (m->_oneof_case_[0] == 500) {
    pNVar4 = (NeuralNetwork *)(m->Type_).pipeline_;
  }
  else {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 500;
    uVar3 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pNVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                       (pAVar8);
    (m->Type_).neuralnetwork_ = pNVar4;
  }
  pRVar2 = (pNVar4->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = (pNVar4->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (pNVar4->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pNVar5 = (NeuralNetworkLayer *)pRVar2->elements[iVar1];
      goto LAB_001de1d0;
    }
  }
  pNVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                     ((pNVar4->layers_).super_RepeatedPtrFieldBase.arena_);
  pNVar5 = (NeuralNetworkLayer *)
           google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pNVar4->layers_).super_RepeatedPtrFieldBase,pNVar5);
LAB_001de1d0:
  uVar3 = (pNVar5->super_MessageLite)._internal_metadata_.ptr_;
  puVar7 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pNVar5->name_,name,puVar7);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar5,input);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar5,output);
  if (pNVar5->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar5);
    pNVar5->_oneof_case_[0] = 0xaf;
    uVar3 = (pNVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar8 = *(Arena **)pAVar8;
    }
    pSVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SoftmaxLayerParams>
                       (pAVar8);
    (pNVar5->layer_).softmax_ = pSVar6;
  }
  return pNVar4;
}

Assistant:

Specification::NeuralNetwork* addSoftmaxLayer(Specification::Model& m, const char *name,  const char *input, const char *output) {
    
    auto neuralNet = m.mutable_neuralnetwork();
    auto softmaxLayer = neuralNet->add_layers();
    
    softmaxLayer->set_name(name);
    softmaxLayer->add_input(input);
    softmaxLayer->add_output(output);
    softmaxLayer->mutable_softmax();
    
    return neuralNet;
}